

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O1

void Imf_2_5::anon_unknown_22::insertChannels
               (Header *header,RgbaChannels rgbaChannels,char *fileName)

{
  ostream *poVar1;
  ArgExc *this;
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  *this_00;
  ChannelList ch;
  stringstream _iex_throw_s;
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  local_1d0;
  Channel local_1a0;
  ostream local_190 [376];
  
  local_1d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d0._M_impl.super__Rb_tree_header._M_header;
  local_1d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d0._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((rgbaChannels & WRITE_YC) == 0) {
    if ((rgbaChannels & WRITE_R) != 0) {
      Channel::Channel(&local_1a0,HALF,1,1,false);
      ChannelList::insert((ChannelList *)&local_1d0,"R",&local_1a0);
    }
    if ((rgbaChannels & WRITE_G) != 0) {
      Channel::Channel(&local_1a0,HALF,1,1,false);
      ChannelList::insert((ChannelList *)&local_1d0,"G",&local_1a0);
    }
    if ((rgbaChannels & WRITE_B) != 0) {
      Channel::Channel(&local_1a0,HALF,1,1,false);
      ChannelList::insert((ChannelList *)&local_1d0,"B",&local_1a0);
    }
  }
  else {
    if ((rgbaChannels & WRITE_Y) != 0) {
      Channel::Channel(&local_1a0,HALF,1,1,false);
      ChannelList::insert((ChannelList *)&local_1d0,"Y",&local_1a0);
    }
    if ((rgbaChannels & WRITE_C) != 0) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>(local_190,"Cannot open file \"",0x12);
      poVar1 = std::operator<<(local_190,fileName);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar1,
                 "\" for writing.  Tiled image files do not support subsampled chroma channels.",
                 0x4c);
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc(this,(stringstream *)&local_1a0);
      __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
  }
  if ((rgbaChannels & WRITE_A) != 0) {
    Channel::Channel(&local_1a0,HALF,1,1,false);
    ChannelList::insert((ChannelList *)&local_1d0,"A",&local_1a0);
  }
  this_00 = (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
             *)Header::channels(header);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  ::operator=(this_00,&local_1d0);
  std::
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  ::~_Rb_tree(&local_1d0);
  return;
}

Assistant:

void
insertChannels (Header &header,
		RgbaChannels rgbaChannels,
		const char fileName[])
{
    ChannelList ch;

    if (rgbaChannels & (WRITE_Y | WRITE_C))
    {
	if (rgbaChannels & WRITE_Y)
	{
	    ch.insert ("Y", Channel (HALF, 1, 1));
	}

	if (rgbaChannels & WRITE_C)
	{
	    THROW (IEX_NAMESPACE::ArgExc, "Cannot open file \"" << fileName << "\" "
				"for writing.  Tiled image files do not "
				"support subsampled chroma channels.");
	}
    }
    else
    {
	if (rgbaChannels & WRITE_R)
	    ch.insert ("R", Channel (HALF, 1, 1));

	if (rgbaChannels & WRITE_G)
	    ch.insert ("G", Channel (HALF, 1, 1));

	if (rgbaChannels & WRITE_B)
	    ch.insert ("B", Channel (HALF, 1, 1));
    }

    if (rgbaChannels & WRITE_A)
	ch.insert ("A", Channel (HALF, 1, 1));

    header.channels() = ch;
}